

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nl-solver.cc
# Opt level: O0

void __thiscall
mp::NLFeeder_Easy::FeedColNames<mp::StringFileWriter>(NLFeeder_Easy *this,StringFileWriter *wrt)

{
  bool bVar1;
  int iVar2;
  NLModel *pNVar3;
  char **ppcVar4;
  NLFeeder_Easy *this_00;
  char *in_RSI;
  NLFeeder_Easy *in_RDI;
  int i;
  char *s;
  StringFileWriter *in_stack_ffffffffffffffd0;
  int local_14;
  
  pNVar3 = NLME(in_RDI);
  ppcVar4 = NLModel::ColNames(pNVar3);
  if ((ppcVar4 != (char **)0x0) &&
     (bVar1 = StringFileWriter::operator_cast_to_bool(in_stack_ffffffffffffffd0), bVar1)) {
    local_14 = 0;
    while( true ) {
      pNVar3 = NLME(in_RDI);
      iVar2 = NLModel::NumCols(pNVar3);
      if (iVar2 <= local_14) break;
      s = in_RSI;
      pNVar3 = NLME(in_RDI);
      this_00 = (NLFeeder_Easy *)NLModel::ColNames(pNVar3);
      VPermInv(this_00,(int)((ulong)s >> 0x20));
      operator<<((StringFileWriter *)this_00,s);
      local_14 = local_14 + 1;
    }
  }
  return;
}

Assistant:

void FeedColNames(ColNameWriter& wrt) {
    if (NLME().ColNames() && wrt) {
      for (int i=0; i<NLME().NumCols(); ++i)
        wrt << NLME().ColNames()[VPermInv(i)];
    }
  }